

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evolution-test.c++
# Opt level: O1

bool capnp::compiler::anon_unknown_0::checkChange
               (Reader file1,Reader file2,ChangeKind changeKind,uint sharedOrdinalCount)

{
  Reader file;
  Reader file_00;
  MessageBuilder *pMVar1;
  MessageBuilder *pMVar2;
  undefined1 auVar3 [8];
  undefined8 uVar4;
  MallocMessageBuilder *pMVar5;
  ExceptionCallback *pEVar6;
  anon_union_344_1_a8c68091_for_NullableValue<kj::Exception>_2 *paVar7;
  byte bVar8;
  Own<capnp::MallocMessageBuilder> OVar9;
  Maybe<kj::Exception> exception;
  undefined1 local_338 [8];
  MallocMessageBuilder *pMStack_330;
  Fault local_320;
  Fault local_318;
  undefined8 uStack_310;
  SchemaLoader local_308;
  NullableValue<kj::Exception> local_2e0;
  Maybe<kj::Exception> local_180;
  
  local_338 = (undefined1  [8])0x0;
  pMStack_330 = (MallocMessageBuilder *)0x0;
  if (changeKind != INCOMPATIBLE) {
    OVar9 = kj::heap<capnp::MallocMessageBuilder>();
    uVar4 = local_2e0.field_1.value.ownFile.content.ptr;
    auVar3 = local_338;
    local_2e0.field_1.value.ownFile.content.ptr = (char *)0x0;
    local_338._4_4_ = local_2e0._4_4_;
    local_338._0_4_ = local_2e0._0_4_;
    pMVar5 = (MallocMessageBuilder *)uVar4;
    if (pMStack_330 != (MallocMessageBuilder *)0x0) {
      pMVar1 = &pMStack_330->super_MessageBuilder;
      pMVar2 = &pMStack_330->super_MessageBuilder;
      pMStack_330 = (MallocMessageBuilder *)uVar4;
      (***(_func_int ***)auVar3)
                (auVar3,(code *)((long)pMVar2->arenaSpace +
                                (long)(pMVar1->_vptr_MessageBuilder[-2] + -8)),OVar9.ptr);
      pMVar5 = pMStack_330;
    }
    pMStack_330 = pMVar5;
    uVar4 = local_2e0.field_1.value.ownFile.content.ptr;
    if ((MallocMessageBuilder *)local_2e0.field_1.value.ownFile.content.ptr !=
        (MallocMessageBuilder *)0x0) {
      local_2e0.field_1.value.ownFile.content.ptr = (char *)0x0;
      (*(code *)**(undefined8 **)CONCAT44(local_2e0._4_4_,local_2e0._0_4_))
                ((undefined8 *)CONCAT44(local_2e0._4_4_,local_2e0._0_4_),
                 (char *)(uVar4 + *(long *)(*(long *)uVar4 + -0x10)));
    }
  }
  SchemaLoader::SchemaLoader(&local_308);
  file._reader.capTable = file1._reader.capTable;
  file._reader.segment = file1._reader.segment;
  file._reader.data = file1._reader.data;
  file._reader.pointers = file1._reader.pointers;
  file._reader.dataSize = file1._reader.dataSize;
  file._reader.pointerCount = file1._reader.pointerCount;
  file._reader._38_2_ = file1._reader._38_2_;
  file._reader.nestingLimit = file1._reader.nestingLimit;
  file._reader._44_4_ = file1._reader._44_4_;
  loadFile(&local_180,file,&local_308,true,(Maybe<kj::Own<capnp::MallocMessageBuilder>_> *)local_338
           ,sharedOrdinalCount);
  if (local_180.ptr.isSet == true) {
    kj::Exception::~Exception(&local_180.ptr.field_1.value);
  }
  file_00._reader.capTable = file2._reader.capTable;
  file_00._reader.segment = file2._reader.segment;
  file_00._reader.data = file2._reader.data;
  file_00._reader.pointers = file2._reader.pointers;
  file_00._reader.dataSize = file2._reader.dataSize;
  file_00._reader.pointerCount = file2._reader.pointerCount;
  file_00._reader._38_2_ = file2._reader._38_2_;
  file_00._reader.nestingLimit = file2._reader.nestingLimit;
  file_00._reader._44_4_ = file2._reader._44_4_;
  loadFile((Maybe<kj::Exception> *)&local_2e0,file_00,&local_308,false,
           (Maybe<kj::Own<capnp::MallocMessageBuilder>_> *)local_338,sharedOrdinalCount);
  if (changeKind == COMPATIBLE) {
    paVar7 = (anon_union_344_1_a8c68091_for_NullableValue<kj::Exception>_2 *)0x0;
    if (local_2e0.isSet != false) {
      paVar7 = &local_2e0.field_1;
    }
    bVar8 = local_2e0.isSet ^ 1;
    if (bVar8 != 0) goto LAB_00150a06;
    pEVar6 = kj::getExceptionCallback();
    (*pEVar6->_vptr_ExceptionCallback[3])(pEVar6,paVar7);
  }
  else {
    if (changeKind != INCOMPATIBLE) {
      bVar8 = 1;
      if (changeKind != SUBTLY_COMPATIBLE) {
        local_320.exception = (Exception *)0x0;
        local_318.exception = (Exception *)0x0;
        uStack_310 = 0;
        kj::_::Debug::Fault::init
                  (&local_320,
                   (EVP_PKEY_CTX *)
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/evolution-test.c++"
                  );
        kj::_::Debug::Fault::fatal(&local_320);
      }
      goto LAB_00150a06;
    }
    if (local_2e0.isSet == false) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,capnp::compiler::ParsedFile::Reader&,capnp::compiler::ParsedFile::Reader&>
                (&local_318,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/evolution-test.c++"
                 ,0x2eb,FAILED,"exception != nullptr","file1, file2",&file1,&file2);
      kj::_::Debug::Fault::fatal(&local_318);
    }
  }
  bVar8 = 0;
LAB_00150a06:
  if (local_2e0.isSet == true) {
    kj::Exception::~Exception(&local_2e0.field_1.value);
  }
  SchemaLoader::~SchemaLoader(&local_308);
  pMVar5 = pMStack_330;
  if (pMStack_330 != (MallocMessageBuilder *)0x0) {
    pMStack_330 = (MallocMessageBuilder *)0x0;
    (***(_func_int ***)local_338)
              (local_338,
               (code *)((long)(pMVar5->super_MessageBuilder).arenaSpace +
                       (long)((pMVar5->super_MessageBuilder)._vptr_MessageBuilder[-2] + -8)));
  }
  return (bool)bVar8;
}

Assistant:

bool checkChange(ParsedFile::Reader file1, ParsedFile::Reader file2, ChangeKind changeKind,
                 uint sharedOrdinalCount) {
  // Try loading file1 followed by file2 into the same SchemaLoader, expecting it to behave
  // according to changeKind.  Returns true if the files are both expected to be compatible and
  // actually are -- the main loop uses this to decide which version to keep

  kj::Maybe<kj::Own<MallocMessageBuilder>> exampleBuilder;

  if (changeKind != INCOMPATIBLE) {
    // For COMPATIBLE and SUBTLY_COMPATIBLE changes, build an example message with one schema
    // and check it with the other.
    exampleBuilder = kj::heap<MallocMessageBuilder>();
  }

  SchemaLoader loader;
  loadFile(file1, loader, true, exampleBuilder, sharedOrdinalCount);
  auto exception = loadFile(file2, loader, false, exampleBuilder, sharedOrdinalCount);

  if (changeKind == COMPATIBLE) {
    KJ_IF_MAYBE(e, exception) {
      kj::getExceptionCallback().onFatalException(kj::mv(*e));
      return false;
    } else {
      return true;
    }
  } else if (changeKind == INCOMPATIBLE) {
    KJ_ASSERT(exception != nullptr, file1, file2);
    return false;
  } else {
    KJ_ASSERT(changeKind == SUBTLY_COMPATIBLE);

    // SchemaLoader is allowed to throw an exception in this case, but we ignore it.
    return true;
  }
}